

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Organya.cpp
# Opt level: O2

void __thiscall OrgData::PlayData(OrgData *this)

{
  byte key;
  int iVar1;
  long lVar2;
  NOTELIST *pNVar3;
  char cVar4;
  long lVar5;
  long lVar6;
  OrgData *pOVar7;
  int *piVar8;
  TRACKDATA *pTVar9;
  
  iVar1 = Volume + -2;
  if (Volume == 0 || !bFadeout) {
    iVar1 = Volume;
  }
  if ((!(bool)(~(Volume != 0 && bFadeout) & -1 < iVar1)) && (Volume = 0, 0 < iVar1)) {
    Volume = iVar1;
  }
  pTVar9 = (this->info).tdata;
  piVar8 = TrackVol;
  lVar6 = 0;
  pOVar7 = this;
  for (lVar5 = -8; lVar5 != 0; lVar5 = lVar5 + 1) {
    lVar2 = *(long *)((long)np + lVar6);
    cVar4 = (char)lVar5;
    if ((lVar2 != 0) && (PlayPos == *(long *)(lVar2 + 0x10))) {
      if ((g_mute[lVar5 + 8] == false) && (key = *(byte *)(lVar2 + 0x19), key != 0xff)) {
        pOVar7 = (OrgData *)(ulong)key;
        PlayOrganObject(key,-1,cVar4 + '\b',(ulong)pTVar9->freq);
        lVar2 = *(long *)((long)np + lVar6);
        *(ulong *)((long)now_leng + lVar6) = (ulong)*(byte *)(lVar2 + 0x18);
      }
      if (*(uchar *)(lVar2 + 0x1b) != 0xff) {
        pOVar7 = (OrgData *)0x0;
        ChangeOrganPan('\0',*(uchar *)(lVar2 + 0x1b),cVar4 + '\b');
        lVar2 = *(long *)((long)np + lVar6);
      }
      if (*(byte *)(lVar2 + 0x1a) != 0xff) {
        *piVar8 = (uint)*(byte *)(lVar2 + 0x1a);
      }
      *(undefined8 *)((long)np + lVar6) = *(undefined8 *)(lVar2 + 8);
    }
    lVar2 = *(long *)((long)now_leng + lVar6);
    if (lVar2 == 0) {
      pOVar7 = (OrgData *)0x0;
      PlayOrganObject('\0',2,cVar4 + '\b',(ulong)pTVar9->freq);
      lVar2 = *(long *)((long)now_leng + lVar6);
    }
    if (0 < lVar2) {
      *(long *)((long)now_leng + lVar6) = lVar2 + -1;
    }
    if (*(long *)((long)np + lVar6) != 0) {
      ChangeOrganVolume((int)pOVar7,(long)((Volume * *piVar8) / 0x7f),cVar4 + '\b');
    }
    piVar8 = (int *)((uint *)piVar8 + 1);
    pTVar9 = pTVar9 + 1;
    lVar6 = lVar6 + 8;
  }
  lVar5 = 0;
  do {
    if (lVar5 == 8) {
      PlayPos = PlayPos + 1;
      if ((this->info).end_x <= PlayPos) {
        PlayPos = (this->info).repeat_x;
        SetPlayPointer(this,PlayPos);
        return;
      }
      return;
    }
    pNVar3 = np[lVar5 + 8];
    if (pNVar3 != (NOTELIST *)0x0) {
      cVar4 = (char)lVar5;
      if (PlayPos == pNVar3->x) {
        if ((pNVar3->y != 0xff) && (g_mute[lVar5 + 8] == false)) {
          PlayDramObject(pNVar3->y,1,cVar4);
          pNVar3 = np[lVar5 + 8];
        }
        if (pNVar3->pan != 0xff) {
          ChangeDramPan(pNVar3->pan,cVar4);
          pNVar3 = np[lVar5 + 8];
        }
        if (pNVar3->volume != 0xff) {
          TrackVol[lVar5 + 8] = (uint)pNVar3->volume;
        }
        pNVar3 = pNVar3->to;
        np[lVar5 + 8] = pNVar3;
        if (pNVar3 == (NOTELIST *)0x0) goto LAB_001113c7;
      }
      ChangeDramVolume((long)((Volume * TrackVol[lVar5 + 8]) / 0x7f),cVar4);
    }
LAB_001113c7:
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void OrgData::PlayData(void)
{
	int i;

	// Handle fading out
	if (bFadeout && Volume)
		Volume -= 2;
	if (Volume < 0)
		Volume = 0;

	// メロディの再生 (Play melody)
	for (i = 0; i < MAXMELODY; i++)
	{
		if (np[i] != NULL && PlayPos == np[i]->x)
		{
			if (!g_mute[i] && np[i]->y != KEYDUMMY)	// 音が来た。 (The sound has come.)
			{
				PlayOrganObject(np[i]->y, -1, i, info.tdata[i].freq);
				now_leng[i] = np[i]->length;
			}

			if (np[i]->pan != PANDUMMY)
				ChangeOrganPan(np[i]->y, np[i]->pan, i);
			if (np[i]->volume != VOLDUMMY)
				TrackVol[i] = np[i]->volume;

			np[i] = np[i]->to;	// 次の音符を指す (Points to the next note)
		}

		if (now_leng[i] == 0)
			PlayOrganObject(0, 2, i, info.tdata[i].freq);

		if (now_leng[i] > 0)
			now_leng[i]--;

		if (np[i])
			ChangeOrganVolume(np[i]->y, TrackVol[i] * Volume / 0x7F, i);
	}

	// ドラムの再生 (Drum playback)
	for (i = MAXMELODY; i < MAXTRACK; i++)
	{
		if (np[i] != NULL && PlayPos == np[i]->x)	// 音が来た。 (The sound has come.)
		{
			if (np[i]->y != KEYDUMMY && !g_mute[i])	// ならす (Tame)
				PlayDramObject(np[i]->y, 1, i - MAXMELODY);

			if (np[i]->pan != PANDUMMY)
				ChangeDramPan(np[i]->pan, i - MAXMELODY);
			if (np[i]->volume != VOLDUMMY)
				TrackVol[i] = np[i]->volume;

			np[i] = np[i]->to;	// 次の音符を指す (Points to the next note)
		}

		if (np[i])
			ChangeDramVolume(TrackVol[i] * Volume / 0x7F, i - MAXMELODY);
	}

	// Looping
	PlayPos++;
	if (PlayPos >= info.end_x)
	{
		PlayPos = info.repeat_x;
		SetPlayPointer(PlayPos);
	}
}